

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

StringObject * parse_user_defined_type_name(LexerState *ls,StringObject *type_name)

{
  ulong uVar1;
  char *pcVar2;
  CompilerState *compiler_state;
  size_t sVar3;
  size_t sVar4;
  StringObject *pSVar5;
  char buffer [256];
  char local_138 [264];
  
  if ((ls->t).token == 0x2e) {
    raviX_next(ls);
    local_138[0xc0] = '\0';
    local_138[0xc1] = '\0';
    local_138[0xc2] = '\0';
    local_138[0xc3] = '\0';
    local_138[0xc4] = '\0';
    local_138[0xc5] = '\0';
    local_138[0xc6] = '\0';
    local_138[199] = '\0';
    local_138[200] = '\0';
    local_138[0xc9] = '\0';
    local_138[0xca] = '\0';
    local_138[0xcb] = '\0';
    local_138[0xcc] = '\0';
    local_138[0xcd] = '\0';
    local_138[0xce] = '\0';
    local_138[0xcf] = '\0';
    local_138[0xd0] = '\0';
    local_138[0xd1] = '\0';
    local_138[0xd2] = '\0';
    local_138[0xd3] = '\0';
    local_138[0xd4] = '\0';
    local_138[0xd5] = '\0';
    local_138[0xd6] = '\0';
    local_138[0xd7] = '\0';
    local_138[0xd8] = '\0';
    local_138[0xd9] = '\0';
    local_138[0xda] = '\0';
    local_138[0xdb] = '\0';
    local_138[0xdc] = '\0';
    local_138[0xdd] = '\0';
    local_138[0xde] = '\0';
    local_138[0xdf] = '\0';
    local_138[0xe0] = '\0';
    local_138[0xe1] = '\0';
    local_138[0xe2] = '\0';
    local_138[0xe3] = '\0';
    local_138[0xe4] = '\0';
    local_138[0xe5] = '\0';
    local_138[0xe6] = '\0';
    local_138[0xe7] = '\0';
    local_138[0xe8] = '\0';
    local_138[0xe9] = '\0';
    local_138[0xea] = '\0';
    local_138[0xeb] = '\0';
    local_138[0xec] = '\0';
    local_138[0xed] = '\0';
    local_138[0xee] = '\0';
    local_138[0xef] = '\0';
    local_138[0xf0] = '\0';
    local_138[0xf1] = '\0';
    local_138[0xf2] = '\0';
    local_138[0xf3] = '\0';
    local_138[0xf4] = '\0';
    local_138[0xf5] = '\0';
    local_138[0xf6] = '\0';
    local_138[0xf7] = '\0';
    local_138[0xf8] = '\0';
    local_138[0xf9] = '\0';
    local_138[0xfa] = '\0';
    local_138[0xfb] = '\0';
    local_138[0xfc] = '\0';
    local_138[0xfd] = '\0';
    local_138[0xfe] = '\0';
    local_138[0xff] = '\0';
    local_138[0x80] = '\0';
    local_138[0x81] = '\0';
    local_138[0x82] = '\0';
    local_138[0x83] = '\0';
    local_138[0x84] = '\0';
    local_138[0x85] = '\0';
    local_138[0x86] = '\0';
    local_138[0x87] = '\0';
    local_138[0x88] = '\0';
    local_138[0x89] = '\0';
    local_138[0x8a] = '\0';
    local_138[0x8b] = '\0';
    local_138[0x8c] = '\0';
    local_138[0x8d] = '\0';
    local_138[0x8e] = '\0';
    local_138[0x8f] = '\0';
    local_138[0x90] = '\0';
    local_138[0x91] = '\0';
    local_138[0x92] = '\0';
    local_138[0x93] = '\0';
    local_138[0x94] = '\0';
    local_138[0x95] = '\0';
    local_138[0x96] = '\0';
    local_138[0x97] = '\0';
    local_138[0x98] = '\0';
    local_138[0x99] = '\0';
    local_138[0x9a] = '\0';
    local_138[0x9b] = '\0';
    local_138[0x9c] = '\0';
    local_138[0x9d] = '\0';
    local_138[0x9e] = '\0';
    local_138[0x9f] = '\0';
    local_138[0xa0] = '\0';
    local_138[0xa1] = '\0';
    local_138[0xa2] = '\0';
    local_138[0xa3] = '\0';
    local_138[0xa4] = '\0';
    local_138[0xa5] = '\0';
    local_138[0xa6] = '\0';
    local_138[0xa7] = '\0';
    local_138[0xa8] = '\0';
    local_138[0xa9] = '\0';
    local_138[0xaa] = '\0';
    local_138[0xab] = '\0';
    local_138[0xac] = '\0';
    local_138[0xad] = '\0';
    local_138[0xae] = '\0';
    local_138[0xaf] = '\0';
    local_138[0xb0] = '\0';
    local_138[0xb1] = '\0';
    local_138[0xb2] = '\0';
    local_138[0xb3] = '\0';
    local_138[0xb4] = '\0';
    local_138[0xb5] = '\0';
    local_138[0xb6] = '\0';
    local_138[0xb7] = '\0';
    local_138[0xb8] = '\0';
    local_138[0xb9] = '\0';
    local_138[0xba] = '\0';
    local_138[0xbb] = '\0';
    local_138[0xbc] = '\0';
    local_138[0xbd] = '\0';
    local_138[0xbe] = '\0';
    local_138[0xbf] = '\0';
    local_138[0x40] = '\0';
    local_138[0x41] = '\0';
    local_138[0x42] = '\0';
    local_138[0x43] = '\0';
    local_138[0x44] = '\0';
    local_138[0x45] = '\0';
    local_138[0x46] = '\0';
    local_138[0x47] = '\0';
    local_138[0x48] = '\0';
    local_138[0x49] = '\0';
    local_138[0x4a] = '\0';
    local_138[0x4b] = '\0';
    local_138[0x4c] = '\0';
    local_138[0x4d] = '\0';
    local_138[0x4e] = '\0';
    local_138[0x4f] = '\0';
    local_138[0x50] = '\0';
    local_138[0x51] = '\0';
    local_138[0x52] = '\0';
    local_138[0x53] = '\0';
    local_138[0x54] = '\0';
    local_138[0x55] = '\0';
    local_138[0x56] = '\0';
    local_138[0x57] = '\0';
    local_138[0x58] = '\0';
    local_138[0x59] = '\0';
    local_138[0x5a] = '\0';
    local_138[0x5b] = '\0';
    local_138[0x5c] = '\0';
    local_138[0x5d] = '\0';
    local_138[0x5e] = '\0';
    local_138[0x5f] = '\0';
    local_138[0x60] = '\0';
    local_138[0x61] = '\0';
    local_138[0x62] = '\0';
    local_138[99] = '\0';
    local_138[100] = '\0';
    local_138[0x65] = '\0';
    local_138[0x66] = '\0';
    local_138[0x67] = '\0';
    local_138[0x68] = '\0';
    local_138[0x69] = '\0';
    local_138[0x6a] = '\0';
    local_138[0x6b] = '\0';
    local_138[0x6c] = '\0';
    local_138[0x6d] = '\0';
    local_138[0x6e] = '\0';
    local_138[0x6f] = '\0';
    local_138[0x70] = '\0';
    local_138[0x71] = '\0';
    local_138[0x72] = '\0';
    local_138[0x73] = '\0';
    local_138[0x74] = '\0';
    local_138[0x75] = '\0';
    local_138[0x76] = '\0';
    local_138[0x77] = '\0';
    local_138[0x78] = '\0';
    local_138[0x79] = '\0';
    local_138[0x7a] = '\0';
    local_138[0x7b] = '\0';
    local_138[0x7c] = '\0';
    local_138[0x7d] = '\0';
    local_138[0x7e] = '\0';
    local_138[0x7f] = '\0';
    local_138[0] = '\0';
    local_138[1] = '\0';
    local_138[2] = '\0';
    local_138[3] = '\0';
    local_138[4] = '\0';
    local_138[5] = '\0';
    local_138[6] = '\0';
    local_138[7] = '\0';
    local_138[8] = '\0';
    local_138[9] = '\0';
    local_138[10] = '\0';
    local_138[0xb] = '\0';
    local_138[0xc] = '\0';
    local_138[0xd] = '\0';
    local_138[0xe] = '\0';
    local_138[0xf] = '\0';
    local_138[0x10] = '\0';
    local_138[0x11] = '\0';
    local_138[0x12] = '\0';
    local_138[0x13] = '\0';
    local_138[0x14] = '\0';
    local_138[0x15] = '\0';
    local_138[0x16] = '\0';
    local_138[0x17] = '\0';
    local_138[0x18] = '\0';
    local_138[0x19] = '\0';
    local_138[0x1a] = '\0';
    local_138[0x1b] = '\0';
    local_138[0x1c] = '\0';
    local_138[0x1d] = '\0';
    local_138[0x1e] = '\0';
    local_138[0x1f] = '\0';
    local_138[0x20] = '\0';
    local_138[0x21] = '\0';
    local_138[0x22] = '\0';
    local_138[0x23] = '\0';
    local_138[0x24] = '\0';
    local_138[0x25] = '\0';
    local_138[0x26] = '\0';
    local_138[0x27] = '\0';
    local_138[0x28] = '\0';
    local_138[0x29] = '\0';
    local_138[0x2a] = '\0';
    local_138[0x2b] = '\0';
    local_138[0x2c] = '\0';
    local_138[0x2d] = '\0';
    local_138[0x2e] = '\0';
    local_138[0x2f] = '\0';
    local_138[0x30] = '\0';
    local_138[0x31] = '\0';
    local_138[0x32] = '\0';
    local_138[0x33] = '\0';
    local_138[0x34] = '\0';
    local_138[0x35] = '\0';
    local_138[0x36] = '\0';
    local_138[0x37] = '\0';
    local_138[0x38] = '\0';
    local_138[0x39] = '\0';
    local_138[0x3a] = '\0';
    local_138[0x3b] = '\0';
    local_138[0x3c] = '\0';
    local_138[0x3d] = '\0';
    local_138[0x3e] = '\0';
    local_138[0x3f] = '\0';
    pcVar2 = type_name->str;
    sVar3 = strlen(pcVar2);
    if (sVar3 < 0x100) {
      snprintf(local_138,0x100,"%s",pcVar2);
      while( true ) {
        type_name = check_name_and_next(ls);
        pcVar2 = type_name->str;
        sVar4 = strlen(pcVar2);
        uVar1 = sVar3 + 1 + sVar4;
        if (0xff < uVar1) break;
        snprintf(local_138 + sVar3,0x100 - sVar3,".%s",pcVar2);
        if ((ls->t).token != 0x2e) {
          compiler_state = ls->compiler_state;
          sVar3 = strlen(local_138);
          pSVar5 = raviX_create_string(compiler_state,local_138,(uint32_t)sVar3);
          return pSVar5;
        }
        raviX_next(ls);
        sVar3 = uVar1;
      }
      raviX_syntaxerror(ls,"User defined type name is too long");
    }
    else {
      raviX_syntaxerror(ls,"User defined type name is too long");
    }
  }
  return type_name;
}

Assistant:

static const StringObject *parse_user_defined_type_name(LexerState *ls,
								const StringObject *type_name)
{
	size_t len = 0;
	if (testnext(ls, '.')) {
		char buffer[256] = {0};
		const char *str = type_name->str;
		len = strlen(str);
		if (len >= sizeof buffer) {
			raviX_syntaxerror(ls, "User defined type name is too long");
			return type_name;
		}
		snprintf(buffer, sizeof buffer, "%s", str);
		do {
			type_name = check_name_and_next(ls);
			str = type_name->str;
			size_t newlen = len + strlen(str) + 1;
			if (newlen >= sizeof buffer) {
				raviX_syntaxerror(ls, "User defined type name is too long");
				return type_name;
			}
			snprintf(buffer + len, sizeof buffer - len, ".%s", str);
			len = newlen;
		} while (testnext(ls, '.'));
		type_name = raviX_create_string(ls->compiler_state, buffer, (uint32_t)strlen(buffer));
	}
	return type_name;
}